

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::wallet_tests::WatchOnlyPubKeys::test_method(WatchOnlyPubKeys *this)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  LegacyScriptPubKeyMan *line_num;
  const_string *in_RDI;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *spk_man;
  CKey key;
  CPubKey pubkey;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined5 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0d;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  CKey *this_00;
  LegacyScriptPubKeyMan *this_01;
  const_string local_1a8 [2];
  lazy_ostream local_188 [2];
  assertion_result local_168 [4];
  undefined5 in_stack_ffffffffffffff00;
  undefined3 in_stack_ffffffffffffff05;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::CKey((CKey *)in_stack_fffffffffffffdf8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdf8);
  line_num = CWallet::GetOrCreateLegacyScriptPubKeyMan
                       ((CWallet *)
                        CONCAT17(in_stack_fffffffffffffe0f,
                                 CONCAT16(in_stack_fffffffffffffe0e,
                                          CONCAT15(in_stack_fffffffffffffe0d,
                                                   in_stack_fffffffffffffe08))));
  this_01 = line_num;
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,
                                 CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08))),
               (pointer)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,in_RDI,(size_t)line_num,(const_string *)this_00);
    LegacyDataSPKM::HaveWatchOnly
              ((LegacyDataSPKM *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,
                                 CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08))));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,
                                 CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08))),
               (bool)in_stack_fffffffffffffe07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,
                                 CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08))),
               (pointer)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,
                                 CONCAT15(in_stack_fffffffffffffe0d,in_stack_fffffffffffffe08))),
               (pointer)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (unsigned_long)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffdf8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_168,local_188,local_1a8,0x228,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffdf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe0f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe0f);
  CKey::MakeNewKey((CKey *)CONCAT17(in_stack_fffffffffffffe0f,
                                    CONCAT16(in_stack_fffffffffffffe0e,
                                             CONCAT15(in_stack_fffffffffffffe0d,
                                                      in_stack_fffffffffffffe08))),
                   (bool)in_stack_fffffffffffffe07);
  CKey::GetPubKey(this_00);
  uVar2 = CPubKey::IsCompressed((CPubKey *)in_stack_fffffffffffffdf8);
  if (((uVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!pubkey.IsCompressed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x22d,"void wallet::wallet_tests::WatchOnlyPubKeys::test_method()");
  }
  TestWatchOnlyPubKey((LegacyScriptPubKeyMan *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (CPubKey *)CONCAT35(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00));
  PollutePubKey((CPubKey *)in_RDI);
  TestWatchOnlyPubKey((LegacyScriptPubKeyMan *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (CPubKey *)CONCAT35(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00));
  CKey::MakeNewKey((CKey *)CONCAT17(in_stack_fffffffffffffe0f,
                                    CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe0d,
                                                            in_stack_fffffffffffffe08))),
                   (bool)in_stack_fffffffffffffe07);
  CKey::GetPubKey(this_00);
  bVar3 = CPubKey::IsCompressed((CPubKey *)in_stack_fffffffffffffdf8);
  if (!bVar3) {
    __assert_fail("pubkey.IsCompressed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x237,"void wallet::wallet_tests::WatchOnlyPubKeys::test_method()");
  }
  TestWatchOnlyPubKey((LegacyScriptPubKeyMan *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (CPubKey *)CONCAT35(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00));
  PollutePubKey((CPubKey *)in_RDI);
  TestWatchOnlyPubKey((LegacyScriptPubKeyMan *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (CPubKey *)CONCAT35(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00));
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdf8);
  TestWatchOnlyPubKey((LegacyScriptPubKeyMan *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (CPubKey *)CONCAT35(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00));
  CKey::~CKey((CKey *)in_stack_fffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(WatchOnlyPubKeys)
{
    CKey key;
    CPubKey pubkey;
    LegacyScriptPubKeyMan* spk_man = m_wallet.GetOrCreateLegacyScriptPubKeyMan();

    BOOST_CHECK(!spk_man->HaveWatchOnly());

    // uncompressed valid PubKey
    key.MakeNewKey(false);
    pubkey = key.GetPubKey();
    assert(!pubkey.IsCompressed());
    TestWatchOnlyPubKey(spk_man, pubkey);

    // uncompressed cryptographically invalid PubKey
    PollutePubKey(pubkey);
    TestWatchOnlyPubKey(spk_man, pubkey);

    // compressed valid PubKey
    key.MakeNewKey(true);
    pubkey = key.GetPubKey();
    assert(pubkey.IsCompressed());
    TestWatchOnlyPubKey(spk_man, pubkey);

    // compressed cryptographically invalid PubKey
    PollutePubKey(pubkey);
    TestWatchOnlyPubKey(spk_man, pubkey);

    // invalid empty PubKey
    pubkey = CPubKey();
    TestWatchOnlyPubKey(spk_man, pubkey);
}